

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_internalformativ(NegativeTestContext *ctx)

{
  bool bVar1;
  allocator<char> local_79;
  string local_78;
  GLint params [16];
  
  params[0xc] = -0x32323233;
  params[0xd] = -0x32323233;
  params[0xe] = -0x32323233;
  params[0xf] = -0x32323233;
  params[8] = -0x32323233;
  params[9] = -0x32323233;
  params[10] = -0x32323233;
  params[0xb] = -0x32323233;
  params[4] = -0x32323233;
  params[5] = -0x32323233;
  params[6] = -0x32323233;
  params[7] = -0x32323233;
  params[0] = -0x32323233;
  params[1] = -0x32323233;
  params[2] = -0x32323233;
  params[3] = -0x32323233;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"GL_INVALID_VALUE is generated if bufSize is negative.",&local_79);
  NegativeTestContext::beginSection(ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x8058,0x9380,-1,params);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_ENUM is generated if pname is not GL_SAMPLES or GL_NUM_SAMPLE_COUNTS.",
             &local_79);
  NegativeTestContext::beginSection(ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x8058,0xffffffff,0x10,params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_ENUM is generated if internalformat is not color-, depth-, or stencil-renderable."
             ,&local_79);
  NegativeTestContext::beginSection(ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_EXT_render_snorm");
  if (!bVar1) {
    glu::CallLogWrapper::glGetInternalformativ
              (&ctx->super_CallLogWrapper,0x8d41,0x8f95,0x9380,0x10,params);
    NegativeTestContext::expectError(ctx,0x500);
  }
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d41,0x9274,0x9380,0x10,params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.",
             &local_79);
  NegativeTestContext::beginSection(ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0xffffffff,0x8058,0x9380,0x10,params);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glGetInternalformativ
            (&ctx->super_CallLogWrapper,0x8d40,0x8058,0x9380,0x10,params);
  NegativeTestContext::expectError(ctx,0x500);
  bVar1 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_EXT_sparse_texture");
  if (!bVar1) {
    glu::CallLogWrapper::glGetInternalformativ
              (&ctx->super_CallLogWrapper,0xde1,0x8058,0x9380,0x10,params);
    NegativeTestContext::expectError(ctx,0x500);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_internalformativ (NegativeTestContext& ctx)
{
	GLint params[16];

	deMemset(&params[0], 0xcd, sizeof(params));

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is negative.");
	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, -1, &params[0]);
	ctx.expectError				(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not GL_SAMPLES or GL_NUM_SAMPLE_COUNTS.");
	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RGBA8, -1, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if internalformat is not color-, depth-, or stencil-renderable.");

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_render_snorm"))
	{
		ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_RG8_SNORM, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
		ctx.expectError				(GL_INVALID_ENUM);
	}

	ctx.glGetInternalformativ	(GL_RENDERBUFFER, GL_COMPRESSED_RGB8_ETC2, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_RENDERBUFFER.");
	ctx.glGetInternalformativ	(-1, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);
	ctx.glGetInternalformativ	(GL_FRAMEBUFFER, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
	ctx.expectError				(GL_INVALID_ENUM);

	if (!ctx.getContextInfo().isExtensionSupported("GL_EXT_sparse_texture"))
	{
		ctx.glGetInternalformativ	(GL_TEXTURE_2D, GL_RGBA8, GL_NUM_SAMPLE_COUNTS, 16, &params[0]);
		ctx.expectError				(GL_INVALID_ENUM);
	}

	ctx.endSection();
}